

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O1

bool tyti::stl::read<float>(basic_solid<float> *out,string *fileName)

{
  char cVar1;
  bool bVar2;
  string str;
  ifstream f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  long local_238;
  char local_230;
  undefined7 uStack_22f;
  char local_220 [520];
  
  std::ifstream::ifstream(local_220,(string *)fileName,_S_bin);
  local_238 = 0;
  local_230 = '\0';
  local_240._M_current = &local_230;
  std::istream::seekg((long)local_220,_S_beg);
  cVar1 = std::istream::tellg();
  std::__cxx11::string::resize((ulong)&local_240,cVar1);
  std::istream::seekg((long)local_220,_S_beg);
  std::istream::read(local_220,(long)local_240._M_current);
  std::ifstream::close();
  bVar2 = read<float,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (out,local_240,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_240._M_current + local_238));
  if (local_240._M_current != &local_230) {
    operator_delete(local_240._M_current,CONCAT71(uStack_22f,local_230) + 1);
  }
  std::ifstream::~ifstream(local_220);
  return bVar2;
}

Assistant:

inline bool read(basic_solid<T>& out, const std::string& fileName)
        {
            std::ifstream f(fileName, std::ios::binary);
            std::string str;
            f.seekg(0, std::ios::end);
            str.resize((unsigned)f.tellg());
            f.seekg(0, std::ios::beg);
            f.read(&str[0], str.size());
            f.close();

            return read<T>(out, str.cbegin(), str.cend());
        }